

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHPadding_Test::TestBody(SSLTest_ECHPadding_Test *this)

{
  UniquePtr<SSL_CTX> UVar1;
  bool bVar2;
  SSL_METHOD *meth;
  long lVar3;
  ScopedTrace *this_00;
  char *in_R8;
  char *pcVar4;
  char *in_R9;
  AssertionResult gtest_ar_;
  ScopedTrace gtest_trace_2251;
  AssertHelper local_a8;
  ScopedTrace gtest_trace_2224;
  AssertionResult gtest_ar;
  undefined1 local_88 [16];
  size_t client_hello_len_baseline2;
  size_t ech_len_baseline2;
  size_t client_hello_len;
  size_t ech_len;
  size_t ech_len_baseline;
  size_t client_hello_len_baseline;
  UniquePtr<SSL_CTX> ctx;
  AssertHelper local_40;
  long local_38;
  
  meth = (SSL_METHOD *)TLS_method();
  ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(meth);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
       ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0;
  if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
      ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&client_hello_len_baseline);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x2f5309,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ech_len_baseline,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8a7,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&ech_len_baseline,(Message *)&client_hello_len_baseline);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ech_len_baseline);
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    bVar2 = GetECHLength((SSL_CTX *)
                         ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                         &client_hello_len_baseline,&ech_len_baseline,0x2f6789,in_R8);
    gtest_ar_.success_ = bVar2;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (bVar2) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      lVar3 = 0;
      while (lVar3 != 0x18) {
        client_hello_len = (size_t)*(int *)((long)&DAT_002e9110 + lVar3);
        local_38 = lVar3;
        testing::ScopedTrace::ScopedTrace<unsigned_long>
                  (&gtest_trace_2224,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x8b0,&client_hello_len);
        UVar1 = ctx;
        gtest_ar._0_8_ = local_88;
        std::__cxx11::string::_M_construct((ulong)&gtest_ar,(char)client_hello_len);
        bVar2 = GetECHLength((SSL_CTX *)
                             UVar1._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&ech_len,
                             &client_hello_len_baseline2,gtest_ar._0_8_,in_R8);
        gtest_ar_.success_ = bVar2;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&ech_len_baseline2);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)
                     "GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128, std::string(name_len, \'a\').c_str())"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8b3,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=(&local_a8,(Message *)&ech_len_baseline2);
          testing::internal::AssertHelper::~AssertHelper(&local_a8);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if (ech_len_baseline2 != 0) {
            (**(code **)(*(long *)ech_len_baseline2 + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          this_00 = &gtest_trace_2224;
          goto LAB_0015e2f3;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"client_hello_len","client_hello_len_baseline",&ech_len,
                   &client_hello_len_baseline);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar4 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar4 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&ech_len_baseline2,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8b4,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&ech_len_baseline2,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ech_len_baseline2);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        in_R8 = (char *)&ech_len_baseline;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"ech_len","ech_len_baseline",&client_hello_len_baseline2,
                   (unsigned_long *)in_R8);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          in_R8 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            in_R8 = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&ech_len_baseline2,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8b5,in_R8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&ech_len_baseline2,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ech_len_baseline2);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        testing::ScopedTrace::~ScopedTrace(&gtest_trace_2224);
        lVar3 = local_38 + 4;
      }
      bVar2 = GetECHLength((SSL_CTX *)
                           ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&client_hello_len
                           ,&ech_len,0,in_R8);
      gtest_ar_.success_ = bVar2;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (bVar2) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"client_hello_len","client_hello_len_baseline",
                   &client_hello_len,&client_hello_len_baseline);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&client_hello_len_baseline2,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8bc,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&client_hello_len_baseline2,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)&client_hello_len_baseline2);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        pcVar4 = (char *)&ech_len_baseline;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"ech_len","ech_len_baseline",&ech_len,
                   (unsigned_long *)pcVar4);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&client_hello_len_baseline2,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8bd,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&client_hello_len_baseline2,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)&client_hello_len_baseline2);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        UVar1 = ctx;
        gtest_ar._0_8_ = local_88;
        std::__cxx11::string::_M_construct((ulong)&gtest_ar,-0x60);
        bVar2 = GetECHLength((SSL_CTX *)
                             UVar1._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                             &client_hello_len_baseline2,&ech_len_baseline2,gtest_ar._0_8_,pcVar4);
        gtest_ar_.success_ = bVar2;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (gtest_ar_.success_ != false) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          gtest_ar_._0_8_ = ech_len_baseline + 0x20;
          testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                    ((internal *)&gtest_ar,"ech_len_baseline2","ech_len_baseline + 32",
                     &ech_len_baseline2,(unsigned_long *)&gtest_ar_);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x8c5,pcVar4);
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            if (gtest_ar_._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          pcVar4 = (char *)&client_hello_len_baseline;
          testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
                    ((internal *)&gtest_ar,"client_hello_len_baseline2","client_hello_len_baseline",
                     &client_hello_len_baseline2,(unsigned_long *)pcVar4);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x8c8,pcVar4);
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            if (gtest_ar_._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          for (local_a8.data_ = (AssertHelperData *)0x81; local_a8.data_ < (AssertHelperData *)0xa0;
              local_a8.data_ = (AssertHelperData *)((long)&(local_a8.data_)->type + 1)) {
            testing::ScopedTrace::ScopedTrace<unsigned_long>
                      (&gtest_trace_2251,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x8cb,(unsigned_long *)&local_a8);
            UVar1 = ctx;
            gtest_ar._0_8_ = local_88;
            std::__cxx11::string::_M_construct((ulong)&gtest_ar,(char)local_a8.data_);
            bVar2 = GetECHLength((SSL_CTX *)
                                 UVar1._M_t.
                                 super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                 &client_hello_len,&ech_len,gtest_ar._0_8_,pcVar4);
            gtest_ar_.success_ = bVar2;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            std::__cxx11::string::~string((string *)&gtest_ar);
            if (gtest_ar_.success_ == false) {
              testing::Message::Message((Message *)&gtest_trace_2224);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar_,
                         (AssertionResult *)
                         "GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128, std::string(name_len, \'a\').c_str())"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_40,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x8cd,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=(&local_40,(Message *)&gtest_trace_2224);
              testing::internal::AssertHelper::~AssertHelper(&local_40);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if (_gtest_trace_2224 != (long *)0x0) {
                (**(code **)(*_gtest_trace_2224 + 8))();
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              this_00 = &gtest_trace_2251;
LAB_0015e2f3:
              testing::ScopedTrace::~ScopedTrace(this_00);
              break;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            bVar2 = ech_len == ech_len_baseline2 || ech_len == ech_len_baseline;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ = bVar2;
            if (ech_len != ech_len_baseline2 && ech_len != ech_len_baseline) {
              testing::Message::Message((Message *)&gtest_trace_2224);
              std::ostream::_M_insert<unsigned_long>((ulong)(_gtest_trace_2224 + 2));
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar_,
                         (AssertionResult *)
                         "ech_len == ech_len_baseline || ech_len == ech_len_baseline2","false",
                         "true",in_R9);
              pcVar4 = (char *)gtest_ar._0_8_;
              testing::internal::AssertHelper::AssertHelper
                        (&local_40,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x8ce,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=(&local_40,(Message *)&gtest_trace_2224);
              testing::internal::AssertHelper::~AssertHelper(&local_40);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if (_gtest_trace_2224 != (long *)0x0) {
                (**(code **)(*_gtest_trace_2224 + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            gtest_ar_.success_ =
                 client_hello_len == client_hello_len_baseline2 ||
                 client_hello_len == client_hello_len_baseline;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (client_hello_len != client_hello_len_baseline2 &&
                client_hello_len != client_hello_len_baseline) {
              testing::Message::Message((Message *)&gtest_trace_2224);
              std::ostream::_M_insert<unsigned_long>((ulong)(_gtest_trace_2224 + 2));
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar_,
                         (AssertionResult *)
                         "client_hello_len == client_hello_len_baseline || client_hello_len == client_hello_len_baseline2"
                         ,"false","true",in_R9);
              pcVar4 = (char *)gtest_ar._0_8_;
              testing::internal::AssertHelper::AssertHelper
                        (&local_40,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x8d1,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=(&local_40,(Message *)&gtest_trace_2224);
              testing::internal::AssertHelper::~AssertHelper(&local_40);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if (_gtest_trace_2224 != (long *)0x0) {
                (**(code **)(*_gtest_trace_2224 + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            testing::ScopedTrace::~ScopedTrace(&gtest_trace_2251);
          }
          goto LAB_0015e5a1;
        }
        testing::Message::Message((Message *)&local_a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "GetECHLength(ctx.get(), &client_hello_len_baseline2, &ech_len_baseline2, 128, std::string(128 + 32, \'a\').c_str())"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_trace_2224,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x8c4,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_trace_2224,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_trace_2224);
        std::__cxx11::string::~string((string *)&gtest_ar);
        client_hello_len_baseline = (size_t)local_a8.data_;
      }
      else {
        testing::Message::Message((Message *)&client_hello_len_baseline2);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128, nullptr)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&ech_len_baseline2,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x8bb,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&ech_len_baseline2,(Message *)&client_hello_len_baseline2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ech_len_baseline2);
        std::__cxx11::string::~string((string *)&gtest_ar);
        client_hello_len_baseline = client_hello_len_baseline2;
      }
    }
    else {
      testing::Message::Message((Message *)&client_hello_len);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "GetECHLength(ctx.get(), &client_hello_len_baseline, &ech_len_baseline, 128, \"example.com\")"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&ech_len,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x8ac,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&ech_len,(Message *)&client_hello_len);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ech_len);
      std::__cxx11::string::~string((string *)&gtest_ar);
      client_hello_len_baseline = client_hello_len;
    }
  }
  if ((AssertHelperData *)client_hello_len_baseline != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)client_hello_len_baseline + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
LAB_0015e5a1:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&ctx);
  return;
}

Assistant:

TEST(SSLTest, ECHPadding) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  // Sample lengths with max_name_len = 128 as baseline.
  size_t client_hello_len_baseline, ech_len_baseline;
  ASSERT_TRUE(GetECHLength(ctx.get(), &client_hello_len_baseline,
                           &ech_len_baseline, 128, "example.com"));

  // Check that all name lengths under the server's maximum look the same.
  for (size_t name_len : {1, 2, 32, 64, 127, 128}) {
    SCOPED_TRACE(name_len);
    size_t client_hello_len, ech_len;
    ASSERT_TRUE(GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128,
                             std::string(name_len, 'a').c_str()));
    EXPECT_EQ(client_hello_len, client_hello_len_baseline);
    EXPECT_EQ(ech_len, ech_len_baseline);
  }

  // When sending no SNI, we must still pad as if we are sending one.
  size_t client_hello_len, ech_len;
  ASSERT_TRUE(
      GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128, nullptr));
  EXPECT_EQ(client_hello_len, client_hello_len_baseline);
  EXPECT_EQ(ech_len, ech_len_baseline);

  // Name lengths above the maximum do not get named-based padding, but the
  // overall input is padded to a multiple of 32.
  size_t client_hello_len_baseline2, ech_len_baseline2;
  ASSERT_TRUE(GetECHLength(ctx.get(), &client_hello_len_baseline2,
                           &ech_len_baseline2, 128,
                           std::string(128 + 32, 'a').c_str()));
  EXPECT_EQ(ech_len_baseline2, ech_len_baseline + 32);
  // The ClientHello lengths may match if we are still under the threshold for
  // padding extension.
  EXPECT_GE(client_hello_len_baseline2, client_hello_len_baseline);

  for (size_t name_len = 128 + 1; name_len < 128 + 32; name_len++) {
    SCOPED_TRACE(name_len);
    ASSERT_TRUE(GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128,
                             std::string(name_len, 'a').c_str()));
    EXPECT_TRUE(ech_len == ech_len_baseline || ech_len == ech_len_baseline2)
        << ech_len;
    EXPECT_TRUE(client_hello_len == client_hello_len_baseline ||
                client_hello_len == client_hello_len_baseline2)
        << client_hello_len;
  }
}